

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O1

int flvtag_avcwritenal(flvtag_t *tag,uint8_t *data,size_t size)

{
  uint uVar1;
  uint8_t *puVar2;
  ulong __size;
  ulong uVar3;
  
  if (size != 0) {
    puVar2 = tag->data;
    uVar3 = (ulong)puVar2[3] | (ulong)((uint)puVar2[2] << 8 | (uint)puVar2[1] << 0x10);
    uVar1 = (uint)size;
    __size = (ulong)(uVar1 + (int)uVar3 + 0x13);
    if (tag->aloc < __size) {
      puVar2 = (uint8_t *)realloc(puVar2,__size);
      tag->data = puVar2;
      tag->aloc = __size;
    }
    puVar2 = tag->data;
    *(uint *)(puVar2 + uVar3 + 0xb) =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    memcpy(puVar2 + uVar3 + 0xf,data,size);
    flvtag_updatesize(tag,uVar1 + (int)uVar3 + 4);
  }
  return 1;
}

Assistant:

int flvtag_avcwritenal(flvtag_t* tag, uint8_t* data, size_t size)
{
    if (0 < size) {
        uint32_t flvsize = flvtag_size(tag);
        flvtag_reserve(tag, flvsize + LENGTH_SIZE + size);
        uint8_t* payload = tag->data + FLV_TAG_HEADER_SIZE + flvsize;
        payload[0] = size >> 24; // nalu size
        payload[1] = size >> 16;
        payload[2] = size >> 8;
        payload[3] = size >> 0;
        memcpy(&payload[LENGTH_SIZE], data, size);
        flvtag_updatesize(tag, flvsize + LENGTH_SIZE + size);
    }
    return 1;
}